

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_rsassa_pss_verify_ext
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,
              mbedtls_md_type_t mgf1_hash_id,int expected_salt_len,uchar *sig)

{
  uchar *src;
  ulong slen;
  byte bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  mbedtls_md_info_t *pmVar5;
  size_t sVar6;
  uchar *dst;
  uchar *puVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  uchar *puVar11;
  bool bVar12;
  uchar zeros [8];
  uchar result [64];
  uchar buf [1024];
  mbedtls_md_context_t local_498;
  uchar local_480 [70];
  uchar auStack_43a [2];
  byte local_438 [15];
  uchar auStack_429 [1017];
  
  if (mode == 1) {
    if (ctx->padding != 1) {
      return -0x4080;
    }
    sVar8 = ctx->len;
    if (sVar8 - 0x401 < 0xfffffffffffffc0f) {
      return -0x4080;
    }
  }
  else {
    sVar8 = ctx->len;
    if (sVar8 - 0x401 < 0xfffffffffffffc0f) {
      return -0x4080;
    }
    if (mode == 0) {
      iVar3 = mbedtls_rsa_public(ctx,sig,auStack_43a + 2);
      goto LAB_0011c73f;
    }
  }
  iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,auStack_43a + 2);
LAB_0011c73f:
  if ((iVar3 == 0) && (iVar3 = -0x4100, auStack_43a[sVar8 + 1] == 0xbc)) {
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar5 = mbedtls_md_info_from_type(md_alg);
      if (pmVar5 == (mbedtls_md_info_t *)0x0) {
        return -0x4080;
      }
      bVar1 = mbedtls_md_get_size(pmVar5);
      hashlen = (uint)bVar1;
    }
    pmVar5 = mbedtls_md_info_from_type(mgf1_hash_id);
    iVar3 = -0x4080;
    if (pmVar5 != (mbedtls_md_info_t *)0x0) {
      bVar1 = mbedtls_md_get_size(pmVar5);
      local_480[0] = '\0';
      local_480[1] = '\0';
      local_480[2] = '\0';
      local_480[3] = '\0';
      local_480[4] = '\0';
      local_480[5] = '\0';
      local_480[6] = '\0';
      local_480[7] = '\0';
      sVar6 = mbedtls_mpi_bitlen(&ctx->N);
      if (local_438[0] >> ((char)sVar6 + (char)sVar8 * -8 + 7U & 0x1f) == 0) {
        slen = (ulong)bVar1;
        bVar12 = (sVar6 - 1 & 7) == 0;
        uVar9 = sVar8 - 1;
        if (!bVar12) {
          uVar9 = sVar8;
        }
        if (slen + 2 <= uVar9) {
          mbedtls_md_init(&local_498);
          iVar3 = mbedtls_md_setup(&local_498,pmVar5,0);
          if (iVar3 == 0) {
            dst = auStack_43a + (ulong)bVar12 + 2;
            src = dst + (uVar9 - slen) + -1;
            iVar3 = mgf_mask(dst,~slen + uVar9,src,slen,&local_498);
            if (iVar3 == 0) {
              local_438[0] = local_438[0] &
                             (byte)(0xff >> ((char)uVar9 * '\b' - (char)(sVar6 - 1) & 0x1fU));
              puVar11 = dst + (uVar9 - slen) + -2;
              puVar7 = dst;
              if (dst < puVar11) {
                lVar10 = (uVar9 - slen) + -2;
                do {
                  uVar2 = *dst;
                  puVar7 = dst;
                  if (uVar2 != '\0') goto LAB_0011c8c5;
                  dst = dst + 1;
                  lVar10 = lVar10 + -1;
                  puVar7 = puVar11;
                } while (lVar10 != 0);
              }
              uVar2 = *puVar7;
LAB_0011c8c5:
              iVar3 = -0x4100;
              if (uVar2 == '\x01') {
                sVar8 = (long)src - (long)(puVar7 + 1);
                if ((((expected_salt_len == -1) || (sVar8 == (long)expected_salt_len)) &&
                    (iVar3 = mbedtls_md_starts(&local_498), iVar3 == 0)) &&
                   (((iVar3 = mbedtls_md_update(&local_498,local_480,8), iVar3 == 0 &&
                     (iVar3 = mbedtls_md_update(&local_498,hash,(ulong)hashlen), iVar3 == 0)) &&
                    ((iVar3 = mbedtls_md_update(&local_498,puVar7 + 1,sVar8), iVar3 == 0 &&
                     (iVar3 = mbedtls_md_finish(&local_498,local_480 + 8), iVar3 == 0)))))) {
                  iVar4 = bcmp(src,local_480 + 8,slen);
                  iVar3 = -0x4380;
                  if (iVar4 == 0) {
                    iVar3 = 0;
                  }
                }
              }
            }
          }
          mbedtls_md_free(&local_498);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               mbedtls_md_type_t mgf1_hash_id,
                               int expected_salt_len,
                               const unsigned char *sig )
{
    int ret;
    size_t siglen;
    unsigned char *p;
    unsigned char *hash_start;
    unsigned char result[MBEDTLS_MD_MAX_SIZE];
    unsigned char zeros[8];
    unsigned int hlen;
    size_t observed_salt_len, msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( buf[siglen - 1] != 0xBC )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( mgf1_hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );

    memset( zeros, 0, 8 );

    /*
     * Note: EMSA-PSS verification is over the length of N - 1 bits
     */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;

    if( buf[0] >> ( 8 - siglen * 8 + msb ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
    {
        p++;
        siglen -= 1;
    }

    if( siglen < hlen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    hash_start = p + siglen - hlen - 1;

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        goto exit;

    ret = mgf_mask( p, siglen - hlen - 1, hash_start, hlen, &md_ctx );
    if( ret != 0 )
        goto exit;

    buf[0] &= 0xFF >> ( siglen * 8 - msb );

    while( p < hash_start - 1 && *p == 0 )
        p++;

    if( *p++ != 0x01 )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto exit;
    }

    observed_salt_len = hash_start - p;

    if( expected_salt_len != MBEDTLS_RSA_SALT_LEN_ANY &&
        observed_salt_len != (size_t) expected_salt_len )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto exit;
    }

    /*
     * Generate H = Hash( M' )
     */
    ret = mbedtls_md_starts( &md_ctx );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, zeros, 8 );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, hash, hashlen );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, p, observed_salt_len );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_finish( &md_ctx, result );
    if ( ret != 0 )
        goto exit;

    if( memcmp( hash_start, result, hlen ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto exit;
    }

exit:
    mbedtls_md_free( &md_ctx );

    return( ret );
}